

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml_reporter.c
# Opt level: O0

TestReporter * create_libxml_reporter(char *prefix)

{
  undefined8 *puVar1;
  char *in_RDI;
  XmlMemo_conflict *memo;
  TestReporter *reporter;
  TestReporter *local_8;
  
  local_8 = create_reporter();
  if (local_8 == (TestReporter *)0x0) {
    local_8 = (TestReporter *)0x0;
  }
  else {
    puVar1 = (undefined8 *)malloc(0x10);
    if (puVar1 == (undefined8 *)0x0) {
      destroy_reporter((TestReporter *)0x112a7a);
      local_8 = (TestReporter *)0x0;
    }
    else {
      local_8->memo = puVar1;
      *puVar1 = default_printer;
      file_prefix = in_RDI;
      local_8->start_suite = xml_reporter_start_suite;
      local_8->start_test = xml_reporter_start_test;
      local_8->show_fail = xml_show_fail;
      local_8->show_skip = xml_show_skip;
      local_8->show_incomplete = xml_show_incomplete;
      local_8->finish_test = xml_reporter_finish_test;
      local_8->finish_suite = xml_reporter_finish_suite;
    }
  }
  return local_8;
}

Assistant:

TestReporter *create_libxml_reporter(const char *prefix) {
    TestReporter *reporter;
    XmlMemo *memo;

    reporter = create_reporter();
    if (reporter == NULL) {
        return NULL;
    }

    memo = (XmlMemo *) malloc(sizeof(XmlMemo));
    if (memo == NULL) {
        destroy_reporter(reporter);
        return NULL;
    }
    reporter->memo = memo;
    memo->printer = &default_printer;

    file_prefix = prefix;
    reporter->start_suite = &xml_reporter_start_suite;
    reporter->start_test = &xml_reporter_start_test;
    reporter->show_fail = &xml_show_fail;
    reporter->show_skip = &xml_show_skip;
    reporter->show_incomplete = &xml_show_incomplete;
    reporter->finish_test = &xml_reporter_finish_test;
    reporter->finish_suite = &xml_reporter_finish_suite;
    return reporter;
}